

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

_Bool cave_find_in_range(chunk_conflict *c,loc *grid,loc top_left,loc bottom_right,
                        square_predicate pred)

{
  int *state_00;
  _Bool local_3a;
  _Bool local_39;
  _Bool found;
  int *state;
  square_predicate pred_local;
  loc *grid_local;
  chunk_conflict *c_local;
  loc bottom_right_local;
  loc top_left_local;
  
  state_00 = cave_find_init(top_left,bottom_right);
  local_39 = false;
  while( true ) {
    local_3a = false;
    if (local_39 == false) {
      local_3a = cave_find_get_grid(grid,state_00);
    }
    if (local_3a == false) break;
    local_39 = (*pred)(c,*grid);
  }
  mem_free(state_00);
  return local_39;
}

Assistant:

bool cave_find_in_range(struct chunk *c, struct loc *grid,
		struct loc top_left, struct loc bottom_right,
		square_predicate pred)
{
	int *state = cave_find_init(top_left, bottom_right);
	bool found = false;

	while (!found && cave_find_get_grid(grid, state)) {
		found = pred(c, *grid);
	}
	mem_free(state);
	return found;
}